

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O1

QJsonArray __thiscall QJsonArray::fromStringList(QJsonArray *this,QStringList *list)

{
  QCborContainerPrivate *pQVar1;
  qsizetype i;
  QString *s;
  long in_FS_OFFSET;
  QJsonValue local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->a).d.ptr = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonArray(this);
  if ((list->d).size != 0) {
    s = (list->d).ptr;
    do {
      QJsonValue::QJsonValue(&local_40,s);
      pQVar1 = (this->a).d.ptr;
      if (pQVar1 == (QCborContainerPrivate *)0x0) {
        i = 0;
      }
      else {
        i = (pQVar1->elements).d.size;
      }
      insert(this,i,&local_40);
      QJsonValue::~QJsonValue(&local_40);
      s = s + 1;
    } while (s != (list->d).ptr + (list->d).size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QJsonArray QJsonArray::fromStringList(const QStringList &list)
{
    QJsonArray array;
    for (QStringList::const_iterator it = list.constBegin(); it != list.constEnd(); ++it)
        array.append(QJsonValue(*it));
    return array;
}